

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseConcatExpr(Parser *this)

{
  long *plVar1;
  _Alloc_hider _Var2;
  Parser *in_RSI;
  _Alloc_hider local_48;
  TokenType op;
  _Alloc_hider local_38;
  
  parseAddExpr(this);
  while ((in_RSI->m_currToken).type == Ampersand) {
    op = Ampersand;
    eatToken(in_RSI,Ampersand);
    parseAddExpr((Parser *)&stack0xffffffffffffffc8);
    std::
    make_unique<AST::BinaryExpr,TokenType&,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
              ((TokenType *)&local_48,(unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&op,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)this);
    _Var2._M_p = local_48._M_p;
    local_48._M_p = (pointer)0x0;
    plVar1 = (long *)(this->m_lexer).m_input._M_dataplus._M_p;
    (this->m_lexer).m_input._M_dataplus._M_p = _Var2._M_p;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      if ((long *)local_48._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_48._M_p + 8))();
      }
    }
    if ((long *)local_38._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_38._M_p + 8))();
    }
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseConcatExpr() {
    std::unique_ptr<AST::Expr> expr = parseAddExpr();
    while (m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto right = parseAddExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}